

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ssize_t sVar4;
  size_t extraout_RDX;
  long extraout_RDX_00;
  Slice key;
  Slice k;
  Status local_60;
  Slice local_58;
  Slice local_48;
  Slice local_38;
  
  iVar2 = (*this->iter_->_vptr_Iterator[8])();
  local_58.data_ = (char *)CONCAT44(extraout_var,iVar2);
  (*this->iter_->_vptr_Iterator[9])();
  lVar3 = this->bytes_counter_ - (extraout_RDX_00 + extraout_RDX);
  this->bytes_counter_ = lVar3;
  while (lVar3 < 0) {
    sVar4 = RandomPeriod(this);
    this->bytes_counter_ = this->bytes_counter_ + sVar4;
    key.size_ = extraout_RDX;
    key.data_ = (char *)CONCAT44(extraout_var,iVar2);
    DBImpl::RecordReadSample(this->db_,key);
    lVar3 = this->bytes_counter_;
  }
  bVar1 = ParseInternalKey(&local_58,ikey);
  if (!bVar1) {
    local_38.data_ = "corrupted internal key in DBIter";
    local_38.size_ = 0x20;
    local_48.data_ = "";
    local_48.size_ = 0;
    Status::Corruption(&local_60,&local_38,&local_48);
    Status::operator=(&this->status_,&local_60);
    Status::~Status(&local_60);
  }
  return bVar1;
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey *ikey) {
            Slice k = iter_->key();
            ssize_t n = k.size() + iter_->value().size();
            bytes_counter_ -= n;
            while (bytes_counter_ < 0) {
                bytes_counter_ += RandomPeriod();
                db_->RecordReadSample(k);
            }
            if (!ParseInternalKey(k, ikey)) {
                status_ = Status::Corruption("corrupted internal key in DBIter");
                return false;
            } else {
                return true;
            }
        }